

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_bitmapblit_quint16
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  uchar *in_RCX;
  undefined4 in_ESI;
  unsigned_short color_00;
  undefined8 in_RDI;
  undefined8 in_R8;
  int mapWidth_00;
  QRasterBuffer *unaff_retaddr;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  color_00 = (unsigned_short)((uint)in_ESI >> 0x10);
  mapWidth_00 = (int)((ulong)in_R8 >> 0x20);
  QRgba64::toRgb16((QRgba64 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  qt_bitmapblit_template<unsigned_short>
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,color_00,in_RCX,mapWidth_00,
             in_stack_00000010,in_stack_00000018);
  return;
}

Assistant:

inline static void qt_bitmapblit_quint16(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    qt_bitmapblit_template<quint16>(rasterBuffer, x,  y, color.toRgb16(),
                                    map, mapWidth, mapHeight, mapStride);
}